

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O3

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
liblogger::LogTailIdx::GetList_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,LogTailIdx *this,uint64_t *idx,int maxitems)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  mapped_type *__args;
  _Node *p_Var5;
  ulong uVar6;
  int iVar7;
  ulong local_38;
  
  LogManager::Lock();
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  uVar2 = *idx;
  uVar6 = this->m_current;
  if (uVar6 < uVar2) {
    *idx = uVar6;
  }
  else {
    uVar3 = *(ulong *)((this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    local_38 = uVar2;
    if (uVar2 < uVar3) {
      *idx = uVar3;
      uVar6 = this->m_current;
      local_38 = uVar3;
    }
    if (local_38 < uVar6) {
      iVar7 = 0;
      do {
        __args = std::
                 map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->m_data,&local_38);
        p_Var5 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            __return_storage_ptr__,__args);
        std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_38 = local_38 + 1;
        uVar6 = this->m_current;
        if (uVar6 <= local_38) goto LAB_001347b8;
        bVar4 = iVar7 < maxitems;
        iVar7 = iVar7 + 1;
      } while (bVar4 || maxitems < 1);
      *idx = local_38;
      LogManager::Unlock();
    }
    else {
LAB_001347b8:
      *idx = uVar6;
    }
  }
  LogManager::Unlock();
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string> LogTailIdx::GetList(uint64_t *idx, int maxitems) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::list<std::string> lst;

	if (*idx > m_current)
	{
		*idx = m_current;
		return lst;
	}

	//skip idx to first item in case it has not been used in a while
	std::map<uint64_t, std::string>::iterator it = m_data.begin();
	if (*idx < it->first)
	{
		*idx = it->first;
	}

	int count = 0;
	for(uint64_t i=*idx;i<m_current;i++)
	{
		if (maxitems > 0 && count > maxitems)
		{
			*idx = i;
			LogManager::Unlock();
			return lst;
		}
		lst.push_back(m_data[i]);
		count++;
	}
	*idx = m_current;
	return lst;
}